

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstructionHeuristics.cpp
# Opt level: O0

void ConstructionHeuristics::assignGivenDay(Solution *solution,uint dayIndex,string *skillId)

{
  bool bVar1;
  vector<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
  *this;
  const_reference this_00;
  reference ppTVar2;
  ulong uVar3;
  string *psVar4;
  Scenario *this_01;
  WeekData *this_02;
  ShiftType *this_03;
  string *shift;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>_>
  *this_04;
  reference ppVar5;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>
  *it;
  const_iterator __end2;
  const_iterator __begin2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>_>
  *__range2;
  Turn *local_48;
  Turn *turn;
  const_iterator __end1;
  const_iterator __begin1;
  value_type *__range1;
  int minimum;
  string *skillId_local;
  uint dayIndex_local;
  Solution *solution_local;
  
  this = Solution::getTurns(solution);
  this_00 = std::
            vector<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
            ::at(this,(ulong)dayIndex);
  __end1 = std::vector<Turn_*,_std::allocator<Turn_*>_>::begin(this_00);
  turn = (Turn *)std::vector<Turn_*,_std::allocator<Turn_*>_>::end(this_00);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Turn_*const_*,_std::vector<Turn_*,_std::allocator<Turn_*>_>_>
                                *)&turn);
    if (!bVar1) {
      return;
    }
    ppTVar2 = __gnu_cxx::
              __normal_iterator<Turn_*const_*,_std::vector<Turn_*,_std::allocator<Turn_*>_>_>::
              operator*(&__end1);
    local_48 = *ppTVar2;
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      psVar4 = Turn::getSkill_abi_cxx11_(local_48);
      bVar1 = std::operator!=(psVar4,skillId);
      if (!bVar1) goto LAB_0013d0ad;
    }
    else {
LAB_0013d0ad:
      this_01 = Scenario::getInstance();
      this_02 = Scenario::getWeekData(this_01);
      psVar4 = Turn::getSkill_abi_cxx11_(local_48);
      this_03 = Turn::getShiftType(local_48);
      shift = ShiftType::getId_abi_cxx11_(this_03);
      __range2._4_4_ = dayIndex;
      __range1._4_4_ =
           WeekData::getMinimumCoverageRequirement
                     (this_02,psVar4,shift,(int *)((long)&__range2 + 4));
      if (__range1._4_4_ != 0) {
        this_04 = Solution::getNurses_abi_cxx11_(solution);
        __end2 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>_>
                 ::begin(this_04);
        it = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>
              *)std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>_>
                ::end(this_04);
        while (bVar1 = std::operator!=(&__end2,(_Self *)&it), bVar1) {
          ppVar5 = std::
                   _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>
                   ::operator*(&__end2);
          bVar1 = Solution::assignNurseToTurn(solution,ppVar5->second,local_48);
          if ((bVar1) && (__range1._4_4_ = __range1._4_4_ + -1, __range1._4_4_ < 1)) break;
          std::
          _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>
          ::operator++(&__end2);
        }
      }
    }
    __gnu_cxx::__normal_iterator<Turn_*const_*,_std::vector<Turn_*,_std::allocator<Turn_*>_>_>::
    operator++(&__end1);
  } while( true );
}

Assistant:

void ConstructionHeuristics::assignGivenDay(Solution *solution, unsigned int dayIndex, const string &skillId) {
    int minimum;
    for (Turn *turn : solution->getTurns().at(dayIndex)) {
        if (!skillId.empty() && turn->getSkill() != skillId)
            continue;

        minimum = Scenario::getInstance()->getWeekData().getMinimumCoverageRequirement(turn->getSkill(),
                                                                                       turn->getShiftType()->getId(),
                                                                                       dayIndex);
        if (minimum == 0)
            continue;

        for (auto const &it : solution->getNurses())
            if (solution->assignNurseToTurn(it.second, turn))
                if (--minimum <= 0)
                    break;
    }
}